

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionCosserat.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChDampingCosseratLinear::ComputeDampingMatrix
          (ChDampingCosseratLinear *this,ChMatrixNM<double,_6,_6> *R,ChVector<double> *dstrain_e,
          ChVector<double> *dstrain_k)

{
  Eigen::DenseBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> *)R);
  (R->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0] =
       (this->R_e).m_data[0];
  (R->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[7] =
       (this->R_e).m_data[1];
  (R->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0xe] =
       (this->R_e).m_data[2];
  (R->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x15] =
       (this->R_k).m_data[0];
  (R->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x1c] =
       (this->R_k).m_data[1];
  (R->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x23] =
       (this->R_k).m_data[2];
  return;
}

Assistant:

void ChDampingCosseratLinear::ComputeDampingMatrix(ChMatrixNM<double, 6, 6>& R,
                                                   const ChVector<>& dstrain_e,
                                                   const ChVector<>& dstrain_k) {
    R.setZero();
    R(0, 0) = R_e.x();
    R(1, 1) = R_e.y();
    R(2, 2) = R_e.z();
    R(3, 3) = R_k.x();
    R(4, 4) = R_k.y();
    R(5, 5) = R_k.z();
}